

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,PreOrPostIncOrDec *p)

{
  Allocator *this_00;
  bool bVar1;
  int iVar2;
  Expression *e;
  Expression *source;
  undefined4 extraout_var;
  Variable *pVVar3;
  Constant *pCVar4;
  Expression *pEVar5;
  CodeLocation local_118;
  Expression *local_108;
  Expression *incrementedValue;
  Value local_c0;
  Constant *local_80;
  Constant *one;
  Variable *local_60;
  Variable *oldValue;
  Type type;
  Expression *dest;
  pool_ptr<soul::heart::Variable> pStack_20;
  Op op;
  pool_ptr<soul::heart::Variable> resultDestVar;
  PreOrPostIncOrDec *p_local;
  HEARTGenerator *this_local;
  
  pStack_20.object = (this->currentTargetVariable).object;
  bVar1 = p->isIncrement;
  resultDestVar.object = (Variable *)p;
  e = pool_ref::operator_cast_to_Expression_((pool_ref *)&p->target);
  source = getAsReference(this,e,false);
  iVar2 = (*(source->super_Object)._vptr_Object[2])();
  Type::removeReferenceIfPresent((Type *)&oldValue,(Type *)CONCAT44(extraout_var,iVar2));
  Type::Type((Type *)&one,(Type *)&oldValue);
  pVVar3 = BlockBuilder::createRegisterVariable(&(this->builder).super_BlockBuilder,(Type *)&one);
  Type::~Type((Type *)&one);
  local_60 = pVVar3;
  BlockBuilder::addAssignment(&(this->builder).super_BlockBuilder,&pVVar3->super_Expression,source);
  this_00 = this->module->allocator;
  pEVar5 = &(resultDestVar.object)->super_Expression;
  soul::Value::createInt32<int>((Value *)&incrementedValue,1);
  soul::Value::castToTypeExpectingSuccess(&local_c0,(Value *)&incrementedValue,(Type *)&oldValue);
  pCVar4 = heart::Allocator::allocate<soul::heart::Constant,soul::CodeLocation&,soul::Value>
                     (this_00,(CodeLocation *)&(pEVar5->super_Object).location.location,&local_c0);
  soul::Value::~Value(&local_c0);
  soul::Value::~Value((Value *)&incrementedValue);
  local_80 = pCVar4;
  CodeLocation::CodeLocation
            (&local_118,
             (CodeLocation *)
             &((resultDestVar.object)->super_Expression).super_Object.location.location);
  pEVar5 = BlockBuilder::createBinaryOp
                     (&(this->builder).super_BlockBuilder,&local_118,&local_60->super_Expression,
                      &local_80->super_Expression,(byte)~bVar1 & subtract);
  CodeLocation::~CodeLocation(&local_118);
  local_108 = pEVar5;
  bVar1 = pool_ptr<soul::heart::Variable>::operator==(&stack0xffffffffffffffe0,(void *)0x0);
  if (bVar1) {
    BlockBuilder::addAssignment(&(this->builder).super_BlockBuilder,source,local_108);
  }
  else if (((resultDestVar.object)->role & 0x100) == state) {
    pVVar3 = pool_ptr<soul::heart::Variable>::operator*(&stack0xffffffffffffffe0);
    BlockBuilder::addAssignment
              (&(this->builder).super_BlockBuilder,&pVVar3->super_Expression,local_108);
    pVVar3 = pool_ptr<soul::heart::Variable>::operator*(&stack0xffffffffffffffe0);
    BlockBuilder::addAssignment
              (&(this->builder).super_BlockBuilder,source,&pVVar3->super_Expression);
  }
  else {
    BlockBuilder::addAssignment(&(this->builder).super_BlockBuilder,source,local_108);
    pVVar3 = pool_ptr<soul::heart::Variable>::operator*(&stack0xffffffffffffffe0);
    BlockBuilder::addAssignment
              (&(this->builder).super_BlockBuilder,&pVVar3->super_Expression,
               &local_60->super_Expression);
  }
  Type::~Type((Type *)&oldValue);
  pool_ptr<soul::heart::Variable>::~pool_ptr(&stack0xffffffffffffffe0);
  return;
}

Assistant:

void visit (AST::PreOrPostIncOrDec& p) override
    {
        auto resultDestVar = currentTargetVariable;
        auto op = p.isIncrement ? BinaryOp::Op::add
                                : BinaryOp::Op::subtract;

        auto& dest = getAsReference (p.target, false);
        auto type = dest.getType().removeReferenceIfPresent();

        auto& oldValue = builder.createRegisterVariable (type);
        builder.addAssignment (oldValue, dest);
        auto& one = module.allocator.allocate<heart::Constant> (p.context.location, Value::createInt32 (1).castToTypeExpectingSuccess (type));
        auto& incrementedValue = builder.createBinaryOp (p.context.location, oldValue, one, op);

        if (resultDestVar == nullptr)
        {
            builder.addAssignment (dest, incrementedValue);
        }
        else if (p.isPost)
        {
            builder.addAssignment (dest, incrementedValue);
            builder.addAssignment (*resultDestVar, oldValue);
        }
        else
        {
            builder.addAssignment (*resultDestVar, incrementedValue);
            builder.addAssignment (dest, *resultDestVar);
        }
    }